

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

size_t Catch::listTests(Config *config)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  TestSpec *pTVar3;
  ostream *poVar4;
  ITagAliasRegistry *tagAliases;
  TestSpecParser *this;
  TextAttributes *this_00;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *testCases;
  pointer this_01;
  allocator local_2b9;
  string local_2b8;
  pluralise local_298;
  allocator local_269;
  string local_268;
  pluralise local_248;
  Text local_220;
  Text local_1d0;
  Colour local_17d;
  Code local_17c;
  Colour colourGuard;
  TestCaseInfo *pTStack_178;
  Code colour;
  TestCaseInfo *testCaseInfo;
  __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
  local_168;
  const_iterator itEnd;
  __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
  local_158;
  const_iterator it;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> matchedTestCases;
  TextAttributes tagsAttr;
  TextAttributes nameAttr;
  size_t matchedTests;
  string local_f8;
  TestSpecParser local_d8;
  TestSpec local_50;
  undefined1 local_28 [8];
  TestSpec testSpec;
  Config *config_local;
  
  testSpec.m_filters.
  super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)config;
  iVar2 = (*(config->super_SharedImpl<Catch::IConfig>).super_IConfig.super_IShared.super_NonCopyable
            ._vptr_NonCopyable[0xd])();
  TestSpec::TestSpec((TestSpec *)local_28,(TestSpec *)CONCAT44(extraout_var,iVar2));
  pTVar3 = (TestSpec *)
           (*(code *)((testSpec.m_filters.
                       super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->m_patterns).
                     super__Vector_base<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[0xd].m_p)();
  bVar1 = TestSpec::hasFilters(pTVar3);
  if (bVar1) {
    poVar4 = cout();
    std::operator<<(poVar4,"Matching test cases:\n");
  }
  else {
    poVar4 = cout();
    std::operator<<(poVar4,"All available test cases:\n");
    tagAliases = ITagAliasRegistry::get();
    TestSpecParser::TestSpecParser(&local_d8,tagAliases);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_f8,"*",(allocator *)((long)&matchedTests + 7));
    this = TestSpecParser::parse(&local_d8,&local_f8);
    TestSpecParser::testSpec(&local_50,this);
    TestSpec::operator=((TestSpec *)local_28,&local_50);
    TestSpec::~TestSpec(&local_50);
    std::__cxx11::string::~string((string *)&local_f8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&matchedTests + 7));
    TestSpecParser::~TestSpecParser(&local_d8);
  }
  nameAttr.width = 0;
  Tbc::TextAttributes::TextAttributes((TextAttributes *)&tagsAttr.width);
  Tbc::TextAttributes::TextAttributes
            ((TextAttributes *)
             &matchedTestCases.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  this_00 = Tbc::TextAttributes::setInitialIndent((TextAttributes *)&tagsAttr.width,2);
  Tbc::TextAttributes::setIndent(this_00,4);
  Tbc::TextAttributes::setIndent
            ((TextAttributes *)
             &matchedTestCases.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,6);
  testCases = getAllTestCasesSorted
                        ((IConfig *)
                         testSpec.m_filters.
                         super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
  filterTests((vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)&it,testCases,
              (TestSpec *)local_28,
              (IConfig *)
              testSpec.m_filters.
              super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  itEnd._M_current =
       (TestCase *)
       std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::begin
                 ((vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)&it);
  __gnu_cxx::
  __normal_iterator<Catch::TestCase_const*,std::vector<Catch::TestCase,std::allocator<Catch::TestCase>>>
  ::__normal_iterator<Catch::TestCase*>
            ((__normal_iterator<Catch::TestCase_const*,std::vector<Catch::TestCase,std::allocator<Catch::TestCase>>>
              *)&local_158,
             (__normal_iterator<Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
              *)&itEnd);
  testCaseInfo = (TestCaseInfo *)
                 std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::end
                           ((vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)&it);
  __gnu_cxx::
  __normal_iterator<Catch::TestCase_const*,std::vector<Catch::TestCase,std::allocator<Catch::TestCase>>>
  ::__normal_iterator<Catch::TestCase*>
            ((__normal_iterator<Catch::TestCase_const*,std::vector<Catch::TestCase,std::allocator<Catch::TestCase>>>
              *)&local_168,
             (__normal_iterator<Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
              *)&testCaseInfo);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&local_158,&local_168);
    if (!bVar1) break;
    nameAttr.width = nameAttr.width + 1;
    this_01 = __gnu_cxx::
              __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
              ::operator->(&local_158);
    pTStack_178 = TestCase::getTestCaseInfo(this_01);
    bVar1 = TestCaseInfo::isHidden(pTStack_178);
    local_17c = None;
    if (bVar1) {
      local_17c = FileName;
    }
    Colour::Colour(&local_17d,local_17c);
    poVar4 = cout();
    Tbc::Text::Text(&local_1d0,&pTStack_178->name,(TextAttributes *)&tagsAttr.width);
    poVar4 = Tbc::operator<<(poVar4,&local_1d0);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    Tbc::Text::~Text(&local_1d0);
    bVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty(&pTStack_178->tags);
    if (!bVar1) {
      poVar4 = cout();
      Tbc::Text::Text(&local_220,&pTStack_178->tagsAsString,
                      (TextAttributes *)
                      &matchedTestCases.
                       super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl
                       .super__Vector_impl_data._M_end_of_storage);
      poVar4 = Tbc::operator<<(poVar4,&local_220);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      Tbc::Text::~Text(&local_220);
    }
    Colour::~Colour(&local_17d);
    __gnu_cxx::
    __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
    ::operator++(&local_158);
  }
  pTVar3 = (TestSpec *)
           (*(code *)((testSpec.m_filters.
                       super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->m_patterns).
                     super__Vector_base<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[0xd].m_p)();
  bVar1 = TestSpec::hasFilters(pTVar3);
  if (bVar1) {
    poVar4 = cout();
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_2b8,"matching test case",&local_2b9);
    pluralise::pluralise(&local_298,nameAttr.width,&local_2b8);
    poVar4 = operator<<(poVar4,&local_298);
    poVar4 = std::operator<<(poVar4,'\n');
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    pluralise::~pluralise(&local_298);
    std::__cxx11::string::~string((string *)&local_2b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_2b9);
  }
  else {
    poVar4 = cout();
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_268,"test case",&local_269);
    pluralise::pluralise(&local_248,nameAttr.width,&local_268);
    poVar4 = operator<<(poVar4,&local_248);
    poVar4 = std::operator<<(poVar4,'\n');
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    pluralise::~pluralise(&local_248);
    std::__cxx11::string::~string((string *)&local_268);
    std::allocator<char>::~allocator((allocator<char> *)&local_269);
  }
  std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::~vector
            ((vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)&it);
  TestSpec::~TestSpec((TestSpec *)local_28);
  return nameAttr.width;
}

Assistant:

inline std::size_t listTests( Config const& config ) {

        TestSpec testSpec = config.testSpec();
        if( config.testSpec().hasFilters() )
            Catch::cout() << "Matching test cases:\n";
        else {
            Catch::cout() << "All available test cases:\n";
            testSpec = TestSpecParser( ITagAliasRegistry::get() ).parse( "*" ).testSpec();
        }

        std::size_t matchedTests = 0;
        TextAttributes nameAttr, tagsAttr;
        nameAttr.setInitialIndent( 2 ).setIndent( 4 );
        tagsAttr.setIndent( 6 );

        std::vector<TestCase> matchedTestCases = filterTests( getAllTestCasesSorted( config ), testSpec, config );
        for( std::vector<TestCase>::const_iterator it = matchedTestCases.begin(), itEnd = matchedTestCases.end();
                it != itEnd;
                ++it ) {
            matchedTests++;
            TestCaseInfo const& testCaseInfo = it->getTestCaseInfo();
            Colour::Code colour = testCaseInfo.isHidden()
                ? Colour::SecondaryText
                : Colour::None;
            Colour colourGuard( colour );

            Catch::cout() << Text( testCaseInfo.name, nameAttr ) << std::endl;
            if( !testCaseInfo.tags.empty() )
                Catch::cout() << Text( testCaseInfo.tagsAsString, tagsAttr ) << std::endl;
        }

        if( !config.testSpec().hasFilters() )
            Catch::cout() << pluralise( matchedTests, "test case" ) << '\n' << std::endl;
        else
            Catch::cout() << pluralise( matchedTests, "matching test case" ) << '\n' << std::endl;
        return matchedTests;
    }